

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

Expression * readE(TokenScanner *scanner,int prec)

{
  int prec_00;
  Expression *rhs;
  CompoundExp *this;
  CompoundExp *local_f0;
  string token;
  string local_b8;
  ErrorException err;
  string local_70;
  string local_50;
  
  local_f0 = (CompoundExp *)readT(scanner);
  token._M_dataplus._M_p = (pointer)&token.field_2;
  token._M_string_length = 0;
  token.field_2._M_local_buf[0] = '\0';
  while( true ) {
    TokenScanner::nextToken_abi_cxx11_((string *)&err,scanner);
    std::__cxx11::string::operator=((string *)&token,(string *)&err);
    std::__cxx11::string::~string((string *)&err);
    std::__cxx11::string::string((string *)&local_50,(string *)&token);
    prec_00 = precedence(&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (prec_00 <= prec) break;
    rhs = readE(scanner,prec_00);
    this = (CompoundExp *)operator_new(0x38);
    std::__cxx11::string::string((string *)&local_70,(string *)&token);
    CompoundExp::CompoundExp(this,&local_70,&local_f0->super_Expression,rhs);
    std::__cxx11::string::~string((string *)&local_70);
    local_f0 = this;
  }
  std::__cxx11::string::string((string *)&local_b8,(string *)&token);
  TokenScanner::saveToken(scanner,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&token);
  return &local_f0->super_Expression;
}

Assistant:

Expression *readE(TokenScanner & scanner, int prec) {
   Expression *exp = nullptr;
   Expression *rhs = nullptr;
   exp = readT(scanner);
   string token;
   try {
       while (true) {
           token = scanner.nextToken();
           int newPrec = precedence(token);
           if (newPrec <= prec) break;
           rhs = readE(scanner, newPrec);
           exp = new CompoundExp(token, exp, rhs);
       }
   } catch (ErrorException err) {
       if (exp != nullptr) delete exp;
       if (rhs != nullptr) delete rhs;
   }
   scanner.saveToken(token);
   return exp;
}